

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ulong uVar1;
  vector<quadraple,_std::allocator<quadraple>_> local_c8;
  undefined1 local_b0 [8];
  FinalParser Parser;
  undefined1 local_50 [8];
  vector<quadraple,_std::allocator<quadraple>_> token;
  undefined1 local_30 [8];
  string source;
  
  source.field_2._12_4_ = 0;
  ReadProgram_abi_cxx11_();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Lexical((vector<quadraple,_std::allocator<quadraple>_> *)local_50,(string *)local_30);
    LLGrammatical((vector<quadraple,_std::allocator<quadraple>_> *)local_50);
    std::vector<quadraple,_std::allocator<quadraple>_>::vector
              (&local_c8,(vector<quadraple,_std::allocator<quadraple>_> *)local_50);
    FinalParser::FinalParser((FinalParser *)local_b0,&local_c8);
    std::vector<quadraple,_std::allocator<quadraple>_>::~vector(&local_c8);
    FinalParser::ProcessDecl((FinalParser *)local_b0);
    FinalParser::PrintSymtable((FinalParser *)local_b0);
    FinalParser::Start((FinalParser *)local_b0);
    source.field_2._12_4_ = 0;
    token.super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
    FinalParser::~FinalParser((FinalParser *)local_b0);
    std::vector<quadraple,_std::allocator<quadraple>_>::~vector
              ((vector<quadraple,_std::allocator<quadraple>_> *)local_50);
  }
  else {
    source.field_2._12_4_ = 0;
    token.super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_30);
  return source.field_2._12_4_;
}

Assistant:

int main() {
    string source(ReadProgram());//source code read from file
    if (source.empty()) {//empty file or failed to open file
        return 0;
    }
    //cout<<source<<endl;

    vector <quadraple> token=Lexical(source);
    LLGrammatical(token);
    //LRGrammatical(token);
    FinalParser Parser(token);
    Parser.ProcessDecl();
    Parser.PrintSymtable();
    Parser.Start();
    //Parser.PrintSymtable();
    return 0;
}